

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O2

void __thiscall Element::draw(Element *this,Context *ctx,bool highlight)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Element *pEVar8;
  ALLEGRO_FONT *pAVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  float extraout_XMM0_Da;
  float fVar14;
  double dVar15;
  ulong uVar16;
  double dVar18;
  ulong uVar19;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 uVar17;
  undefined4 uVar20;
  
  pEVar8 = this->attached_to;
  if (pEVar8 != (Element *)0x0) {
    draw_arrow(this,ctx,(float)(pEVar8->w / 2 + pEVar8->x),(float)(pEVar8->h + pEVar8->y),highlight)
    ;
  }
  local_38._0_4_ = (ctx->fg).r;
  local_38._4_4_ = (ctx->fg).g;
  local_48._0_4_ = (ctx->fg).b;
  local_48._4_4_ = (ctx->fg).a;
  local_68 = local_48;
  local_58 = local_38;
  if (highlight) {
    local_58._0_4_ = (ctx->highlight).r;
    local_58._4_4_ = (ctx->highlight).g;
    local_68._0_4_ = (ctx->highlight).b;
    local_68._4_4_ = (ctx->highlight).a;
  }
  iVar11 = (*this->_vptr_Element[2])(this);
  uVar1._0_4_ = (ctx->fill).r;
  uVar1._4_4_ = (ctx->fill).g;
  uVar2._0_4_ = (ctx->fill).b;
  uVar2._4_4_ = (ctx->fill).a;
  if ((char)iVar11 == '\0') {
    local_38._0_4_ = (ctx->disabled).r;
    local_38._4_4_ = (ctx->disabled).g;
    local_48._0_4_ = (ctx->disabled).b;
    local_48._4_4_ = (ctx->disabled).a;
  }
  dVar15 = (double)(this->x + this->w) + -0.5;
  dVar18 = (double)(this->y + this->h) + -0.5;
  al_draw_filled_rounded_rectangle
            ((float)this->x + 0.5,(float)this->y + 0.5,
             CONCAT44((int)((ulong)dVar15 >> 0x20),(float)dVar15),
             CONCAT44((int)((ulong)dVar18 >> 0x20),(float)dVar18),0x40e00000,0x40e00000,uVar1,uVar2)
  ;
  dVar15 = (double)(this->x + this->w) + -0.5;
  dVar18 = (double)(this->y + this->h) + -0.5;
  al_draw_rounded_rectangle
            ((float)this->x + 0.5,(float)this->y + 0.5,
             CONCAT44((int)((ulong)dVar15 >> 0x20),(float)dVar15),
             CONCAT44((int)((ulong)dVar18 >> 0x20),(float)dVar18),0x40e00000,0x40e00000,local_58,
             local_68);
  iVar12 = al_get_font_line_height(ctx->font);
  pAVar9 = ctx->font;
  iVar11 = this->w;
  iVar5 = this->x;
  iVar6 = this->h;
  iVar7 = this->y;
  iVar13 = (*this->_vptr_Element[6])(this);
  uVar16 = (ulong)(uint)(float)(iVar11 / 2 + iVar5);
  uVar19 = (ulong)(uint)((float)iVar12 * -0.5 + (float)(iVar6 / 2 + iVar7));
  al_draw_text((undefined4)local_38,(undefined4)local_48,uVar16,uVar19,pAVar9,1,iVar13);
  uVar20 = (undefined4)(uVar19 >> 0x20);
  uVar17 = (undefined4)(uVar16 >> 0x20);
  (*this->_vptr_Element[4])(this);
  if (extraout_XMM0_Da <= 0.0) {
    return;
  }
  fVar14 = 2.0;
  if (extraout_XMM0_Da <= 2.0) {
    fVar14 = extraout_XMM0_Da;
  }
  fVar10 = (float)(this->w + this->x);
  uVar3._0_4_ = (ctx->fg).r;
  uVar3._4_4_ = (ctx->fg).g;
  uVar4._0_4_ = (ctx->fg).b;
  uVar4._4_4_ = (ctx->fg).a;
  al_draw_rectangle(fVar10 + 1.5,(float)this->h * (fVar14 * -0.5 + 1.0) + (float)this->y,
                    CONCAT44(uVar17,fVar10 + 3.5),CONCAT44(uVar20,(float)(this->h + this->y)),uVar3,
                    uVar4,0x3f800000);
  return;
}

Assistant:

void Element::draw(Context const& ctx, bool highlight) const
{
   if (attached_to) {
      float x2, y2;
      attached_to->input_point(x2, y2);
      draw_arrow(ctx, x2, y2, highlight);
   }

   ALLEGRO_COLOR textcol = ctx.fg;
   ALLEGRO_COLOR boxcol = ctx.fg;
   if (highlight)
      boxcol = ctx.highlight;
   if (!is_playing())
      textcol = ctx.disabled;

   float rad = 7.0;
   al_draw_filled_rounded_rectangle(x+0.5, y+0.5, x+w-0.5, y+h-0.5, rad, rad, ctx.fill);
   al_draw_rounded_rectangle(x+0.5, y+0.5, x+w-0.5, y+h-0.5, rad, rad, boxcol, 1.0);

   float th = al_get_font_line_height(ctx.font);
   al_draw_text(ctx.font, textcol, x + w/2, y + h/2 - th/2,
      ALLEGRO_ALIGN_CENTRE, get_label());

   float gain = get_gain();
   if (gain > 0.0) {
      float igain = 1.0 - clamp(0.0, gain, 2.0)/2.0;
      al_draw_rectangle(x+w+1.5, y+h*igain, x+w+3.5, y+h, ctx.fg, 1.0);
   }
}